

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

string * __thiscall
smf::MidiMessage::getMetaContent_abi_cxx11_(string *__return_storage_ptr__,MidiMessage *this)

{
  bool bVar1;
  byte *pbVar2;
  size_type sVar3;
  undefined4 local_38;
  int i;
  undefined4 local_24;
  int start;
  MidiMessage *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = isMetaMessage(this);
  if (bVar1) {
    local_24 = 3;
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
    if (0x7f < *pbVar2) {
      local_24 = 4;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3);
      if (0x7f < *pbVar2) {
        local_24 = 5;
        pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,4);
        if (0x7f < *pbVar2) {
          local_24 = 6;
          pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,5);
          if (0x7f < *pbVar2) {
            local_24 = 7;
          }
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    for (local_38 = local_24;
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>),
        local_38 < (int)sVar3; local_38 = local_38 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,(long)local_38);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiMessage::getMetaContent(void) const {
	std::string output;
	if (!isMetaMessage()) {
		return output;
	}
	int start = 3;
	if (operator[](2) > 0x7f) {
		start++;
		if (operator[](3) > 0x7f) {
			start++;
			if (operator[](4) > 0x7f) {
				start++;
				if (operator[](5) > 0x7f) {
					start++;
					// maximum of 5 bytes in VLV, so last must be < 0x80
				}
			}
		}
	}
	output.reserve(this->size());
	for (int i=start; i<(int)this->size(); i++) {
		output.push_back(operator[](i));
	}
	return output;
}